

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O0

void duckdb::BitStringBitwiseOperation::Assign<duckdb::string_t,duckdb::BitState<duckdb::string_t>>
               (BitState<duckdb::string_t> *state,string_t input)

{
  bool bVar1;
  string_t *this;
  char *__dest;
  char *__src;
  char *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  char *ptr;
  idx_t len;
  string_t *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined4 local_30;
  uint32_t in_stack_ffffffffffffffd4;
  char *data;
  anon_union_16_2_67f50693_for_value local_10;
  
  local_10._0_8_ = in_RSI;
  local_10.pointer.ptr = in_RDX;
  bVar1 = string_t::IsInlined((string_t *)0x97a48d);
  if (bVar1) {
    *(undefined8 *)(in_RDI + 8) = local_10._0_8_;
    *(char **)(in_RDI + 0x10) = local_10.pointer.ptr;
  }
  else {
    this = (string_t *)string_t::GetSize((string_t *)&local_10.pointer);
    __dest = (char *)operator_new__((ulong)this);
    data = __dest;
    __src = string_t::GetData(in_stack_ffffffffffffffc0);
    memcpy(__dest,__src,(size_t)this);
    UnsafeNumericCast<unsigned_int,unsigned_long,void>((unsigned_long)this);
    string_t::string_t(this,data,in_stack_ffffffffffffffd4);
    *(undefined8 *)(in_RDI + 8) = local_38;
    *(ulong *)(in_RDI + 0x10) = CONCAT44(in_stack_ffffffffffffffd4,local_30);
  }
  return;
}

Assistant:

static void Assign(STATE &state, INPUT_TYPE input) {
		D_ASSERT(state.is_set == false);
		if (input.IsInlined()) {
			state.value = input;
		} else { // non-inlined string, need to allocate space for it
			auto len = input.GetSize();
			auto ptr = new char[len];
			memcpy(ptr, input.GetData(), len);

			state.value = string_t(ptr, UnsafeNumericCast<uint32_t>(len));
		}
	}